

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O1

PlatformSpecificMutex PThreadMutexCreate(void)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/Platforms/Gcc/UtestPlatform.cpp"
                         ,0x130);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  return __mutex;
}

Assistant:

static PlatformSpecificMutex PThreadMutexCreate(void)
{
#ifdef CPPUTEST_HAVE_PTHREAD_MUTEX_LOCK
    pthread_mutex_t *mutex = new pthread_mutex_t;

    pthread_mutex_init(mutex, NULLPTR);
    return (PlatformSpecificMutex)mutex;
#else
    return NULLPTR;
#endif

}